

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalserver_unix.cpp
# Opt level: O0

bool QLocalServerPrivate::removeServer(QString *name)

{
  byte bVar1;
  ulong uVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<char16_t,_const_QString_&> QVar3;
  QString fileName;
  QString *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  bool local_6b;
  undefined6 in_stack_ffffffffffffff9a;
  undefined1 local_40 [30];
  QChar local_22;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_20.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_20.d.size = -0x5555555555555556;
  QString::QString((QString *)0x3846c5);
  QChar::QChar<char16_t,_true>(&local_22,L'/');
  uVar2 = QString::startsWith((QChar)(char16_t)in_RDI,(uint)(ushort)local_22.ucs);
  if ((uVar2 & 1) == 0) {
    QDir::tempPath();
    QDir::cleanPath((QString *)local_40);
    QString::operator=((QString *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                       in_stack_ffffffffffffff68);
    QString::~QString((QString *)0x38473b);
    QString::~QString((QString *)0x384745);
    QVar3 = ::operator+((char16_t *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff68);
    ::operator+=(QVar3.b,(QStringBuilder<char16_t,_const_QString_&> *)
                         CONCAT62(in_stack_ffffffffffffff9a,QVar3.a));
  }
  else {
    QString::operator=(&local_20,in_RDI);
  }
  uVar2 = QFile::exists((QString *)&local_20);
  if ((uVar2 & 1) == 0) {
    local_6b = true;
  }
  else {
    bVar1 = QFile::remove((QString *)&local_20);
    local_6b = (bool)(bVar1 & 1);
  }
  QString::~QString((QString *)0x3847b5);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_6b;
  }
  __stack_chk_fail();
}

Assistant:

bool QLocalServerPrivate::removeServer(const QString &name)
{
    QString fileName;
    if (name.startsWith(u'/')) {
        fileName = name;
    } else {
        fileName = QDir::cleanPath(QDir::tempPath());
        fileName += u'/' + name;
    }
    if (QFile::exists(fileName))
        return QFile::remove(fileName);
    else
        return true;
}